

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doit_fast<frozen::basic_string<char>const*,31ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  char cVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  basic_string<char> *it;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  plVar5 = *(long **)this;
  uVar6 = *(ulong *)(first + 0xf8);
  uVar7 = plVar5[1];
  uVar8 = uVar7;
  if (uVar6 < uVar7) {
    uVar8 = uVar6;
  }
  if (uVar8 != 0) {
    uVar9 = 1;
    uVar10 = 0;
    do {
      cVar4 = *(char *)(*(long *)(first + 0xf0) + uVar10);
      if (cVar4 != *(char *)(*plVar5 + uVar10)) {
        bVar11 = cVar4 < *(char *)(*plVar5 + uVar10);
        goto LAB_00188fc7;
      }
      uVar10 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar10 < uVar8);
  }
  bVar11 = uVar6 < uVar7;
LAB_00188fc7:
  lVar1 = first + (ulong)bVar11 * 0x100;
  uVar6 = *(ulong *)(first + 0x78 + (ulong)bVar11 * 0x100);
  uVar8 = uVar7;
  if (uVar6 < uVar7) {
    uVar8 = uVar6;
  }
  if (uVar8 != 0) {
    uVar9 = 1;
    uVar10 = 0;
    do {
      cVar4 = *(char *)(*(long *)(lVar1 + 0x70) + uVar10);
      if (cVar4 != *(char *)(*plVar5 + uVar10)) {
        bVar11 = cVar4 < *(char *)(*plVar5 + uVar10);
        goto LAB_00189017;
      }
      uVar10 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar10 < uVar8);
  }
  bVar11 = uVar6 < uVar7;
LAB_00189017:
  lVar2 = lVar1 + (ulong)bVar11 * 0x80;
  uVar6 = *(ulong *)(lVar1 + 0x38 + (ulong)bVar11 * 0x80);
  uVar8 = uVar7;
  if (uVar6 < uVar7) {
    uVar8 = uVar6;
  }
  if (uVar8 != 0) {
    uVar9 = 1;
    uVar10 = 0;
    do {
      cVar4 = *(char *)(*(long *)(lVar2 + 0x30) + uVar10);
      if (cVar4 != *(char *)(*plVar5 + uVar10)) {
        bVar11 = cVar4 < *(char *)(*plVar5 + uVar10);
        goto LAB_00189066;
      }
      uVar10 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar10 < uVar8);
  }
  bVar11 = uVar6 < uVar7;
LAB_00189066:
  lVar1 = lVar2 + (ulong)bVar11 * 0x40;
  uVar6 = *(ulong *)(lVar2 + 0x18 + (ulong)bVar11 * 0x40);
  uVar8 = uVar7;
  if (uVar6 < uVar7) {
    uVar8 = uVar6;
  }
  if (uVar8 != 0) {
    uVar9 = 1;
    uVar10 = 0;
    do {
      cVar4 = *(char *)(*(long *)(lVar1 + 0x10) + uVar10);
      if (cVar4 != *(char *)(*plVar5 + uVar10)) {
        bVar11 = cVar4 < *(char *)(*plVar5 + uVar10);
        goto LAB_001890b4;
      }
      uVar10 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar10 < uVar8);
  }
  bVar11 = uVar6 < uVar7;
LAB_001890b4:
  plVar3 = (long *)(lVar1 + (ulong)bVar11 * 0x20);
  uVar6 = *(ulong *)(lVar1 + 8 + (ulong)bVar11 * 0x20);
  uVar8 = uVar7;
  if (uVar6 < uVar7) {
    uVar8 = uVar6;
  }
  if (uVar8 != 0) {
    uVar9 = 1;
    uVar10 = 0;
    do {
      cVar4 = *(char *)(*plVar3 + uVar10);
      if (cVar4 != *(char *)(*plVar5 + uVar10)) {
        bVar11 = cVar4 < *(char *)(*plVar5 + uVar10);
        goto LAB_00189101;
      }
      uVar10 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar10 < uVar8);
  }
  bVar11 = uVar6 < uVar7;
LAB_00189101:
  return (basic_string<char> *)(plVar3 + (ulong)bVar11 * 2);
}

Assistant:

inline constexpr ForwardIt doit_fast(ForwardIt first,
                                  std::integral_constant<std::size_t, N>) {
    auto constexpr step = N / 2;
    static_assert(N/2 == N - N / 2 - 1, "power of two minus 1");
    auto it = first + step;
    auto next_it = compare_(*it, value_) ? it + 1 : first;
    return doit_fast(next_it, std::integral_constant<std::size_t, N / 2>{});
  }